

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

Array<asl::Map<asl::String,_asl::String>::KeyVal> * __thiscall
asl::Array<asl::Map<asl::String,_asl::String>::KeyVal>::insert
          (Array<asl::Map<asl::String,_asl::String>::KeyVal> *this,int k,KeyVal *x)

{
  KeyVal *this_00;
  KeyVal *pKVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  int iVar6;
  anon_union_16_2_78e7fdac_for_String_2 *paVar7;
  anon_union_16_2_78e7fdac_for_String_2 *paVar8;
  int iVar9;
  KeyVal *pKVar10;
  anon_union_16_2_78e7fdac_for_String_2 *local_40;
  
  pKVar10 = this->_a;
  iVar2 = *(int *)&pKVar10[-1].value.field_2;
  iVar3 = *(int *)((long)&pKVar10[-1].value.field_2 + 4);
  iVar6 = k;
  if (k < 0) {
    iVar6 = iVar2;
  }
  if (iVar2 < iVar3) {
    local_40 = &pKVar10[-1].value.field_2;
LAB_0011b807:
    if (iVar2 - iVar6 != 0 && iVar6 <= iVar2) {
      memmove(pKVar10 + (long)iVar6 + 1,pKVar10 + iVar6,(long)(iVar2 - iVar6) * 0x30);
      pKVar10 = this->_a;
    }
    this_00 = pKVar10 + iVar6;
    iVar3 = (x->key)._len;
    String::alloc(&this_00->key,iVar3);
    pKVar1 = pKVar10 + iVar6;
    paVar8 = &(pKVar1->key).field_2;
    (pKVar1->key)._len = iVar3;
    if ((pKVar1->key)._size != 0) {
      paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)pKVar10[iVar6].key.field_2._str;
    }
    if ((x->key)._size == 0) {
      paVar7 = &(x->key).field_2;
    }
    else {
      paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(x->key).field_2._str;
    }
    memcpy(paVar8,paVar7,(long)iVar3 + 1);
    iVar3 = (x->value)._len;
    String::alloc(&pKVar10[iVar6].value,iVar3);
    (this_00->value)._len = iVar3;
    if ((this_00->value)._size == 0) {
      paVar8 = &(this_00->value).field_2;
    }
    else {
      paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)(this_00->value).field_2._str;
    }
    if ((x->value)._size == 0) {
      paVar7 = &(x->value).field_2;
    }
    else {
      paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(x->value).field_2._str;
    }
    memcpy(paVar8,paVar7,(long)iVar3 + 1);
    *(int *)local_40 = iVar2 + 1;
    return this;
  }
  if (iVar2 != 0x7fffffff) {
    dup(this,k);
    iVar4 = *(int *)((long)&this->_a[-1].value.field_2 + 8);
    iVar9 = 0x7fffffff;
    if (iVar3 < 0x3ffffffe) {
      iVar9 = iVar3 * 2 + 2;
    }
    local_40 = (anon_union_16_2_78e7fdac_for_String_2 *)
               realloc(&this->_a[-1].value.field_2,(long)iVar9 * 0x30 + 0x10);
    if (local_40 != (anon_union_16_2_78e7fdac_for_String_2 *)0x0) {
      pKVar10 = (KeyVal *)(local_40 + 1);
      this->_a = pKVar10;
      *(int *)((long)local_40 + 4) = iVar9;
      *(int *)((long)local_40 + 8) = iVar4;
      goto LAB_0011b807;
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = dup2;
  __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}